

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nussinov.cpp
# Opt level: O2

tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
Nussinov::nussinov_abi_cxx11_
          (tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Nussinov *this,ostream *fout)

{
  pointer ptVar1;
  pointer piVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  uint i_00;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  int extraout_EAX_11;
  int extraout_EAX_12;
  int extraout_EAX_13;
  int extraout_EAX_14;
  int extraout_EAX_15;
  int extraout_EAX_16;
  ostream *poVar11;
  long lVar12;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  int (*paaiVar16) [6] [3];
  int (*paiVar17) [3];
  int (*paiVar18) [3];
  long lVar19;
  uint b;
  int iVar20;
  ulong uVar22;
  long lVar23;
  uint b_00;
  int i_01;
  int a_00;
  void *pvVar25;
  int i;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  int a;
  int x;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double local_158;
  double local_148;
  ulong local_128;
  int (*local_e8) [3];
  int (*local_e0) [3];
  double local_c0;
  ulong local_b0;
  ulong local_a8;
  string rna;
  string bp;
  ulong uVar21;
  char *pcVar24;
  
  std::chrono::_V2::system_clock::now();
  poVar11 = std::operator<<(fout,"Nussinov");
  std::endl<char,std::char_traits<char>>(poVar11);
  for (uVar32 = 0; pvVar25 = (void *)(long)this->n, (long)uVar32 < (long)pvVar25;
      uVar32 = uVar32 + 1) {
    uVar31 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar32]];
    if (n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar32]] < 1) {
      uVar31 = 0;
    }
    paaiVar16 = nucleotides;
    local_128 = 3;
    for (lVar19 = 0; lVar19 != 3; lVar19 = lVar19 + 1) {
      local_e0 = nucleotides[0];
      uVar27 = 0;
      local_e8 = *paaiVar16;
      for (; uVar27 != local_128; uVar27 = uVar27 + 1) {
        iVar9 = (int)uVar32;
        iVar7 = (int)(uVar27 + lVar19);
        iVar5 = sigma(iVar9,iVar7);
        iVar8 = (int)uVar27;
        iVar6 = sigma(iVar9,iVar8);
        if (this->g < iVar5 - iVar6) {
          iVar5 = iVar8 + (int)lVar19;
          paiVar17 = local_e0;
          paiVar18 = local_e8;
          for (uVar30 = 0; uVar31 != uVar30; uVar30 = uVar30 + 1) {
            lVar12 = (long)(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar32];
            bVar4 = complementary(paiVar17[lVar12 * 6][0],paiVar18[lVar12 * 6][0]);
            local_158 = 0.0;
            iVar6 = (int)uVar30;
            if (((long)uVar27 < (long)(iVar5 + -1) && (uVar27 + lVar19 != 0 && uVar27 < 2)) && bVar4
               ) {
              pdVar13 = Access(this,iVar9,iVar9,iVar8 + 1,iVar7 + -1,iVar6,iVar6);
              local_158 = *pdVar13 + 1.0;
              if (local_158 <= 0.0) {
                local_158 = 0.0;
              }
            }
            if (lVar19 != 0) {
              pdVar13 = Access(this,iVar9,iVar9,iVar8 + 1,iVar7,iVar6,iVar6);
              dVar35 = *pdVar13;
              if (*pdVar13 <= local_158) {
                dVar35 = local_158;
              }
              pdVar13 = Access(this,iVar9,iVar9,iVar8,iVar5 + -1,iVar6,iVar6);
              local_158 = *pdVar13;
              if (*pdVar13 <= dVar35) {
                local_158 = dVar35;
              }
            }
            m((void *)(ulong)(uint)this->n,iVar9,(char *)(uVar32 & 0xffffffff),iVar8,iVar5);
            ptVar1 = (this->codon_index).
                     super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + extraout_EAX;
            if (*(double *)
                 &(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                  super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <= local_158 &&
                local_158 !=
                *(double *)
                 &(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                  super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>) {
              m((void *)(ulong)(uint)this->n,iVar9,(char *)(uVar32 & 0xffffffff),iVar8,iVar5);
              ptVar1 = (this->codon_index).
                       super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(int *)&ptVar1[extraout_EAX_00].super__Tuple_impl<0UL,_int,_int,_double>.
                       super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar6;
              ptVar1[extraout_EAX_00].super__Tuple_impl<0UL,_int,_int,_double>.
              super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar6;
              ptVar1[extraout_EAX_00].super__Tuple_impl<0UL,_int,_int,_double>.
              super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                   (_Tuple_impl<2UL,_double>)local_158;
            }
            m((void *)(ulong)(uint)this->n,iVar9,(char *)(uVar32 & 0xffffffff),iVar8,iVar5);
            ptVar1 = (this->codon_index_x).
                     super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_01;
            if (*(double *)
                 &(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                  super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <= local_158 &&
                local_158 !=
                *(double *)
                 &(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                  super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>) {
              m((void *)(ulong)(uint)this->n,iVar9,(char *)(uVar32 & 0xffffffff),iVar8,iVar5);
              ptVar1 = (this->codon_index_x).
                       super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(int *)&ptVar1[extraout_EAX_02].super__Tuple_impl<0UL,_int,_int,_double>.
                       super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar6;
              ptVar1[extraout_EAX_02].super__Tuple_impl<0UL,_int,_int,_double>.
              super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar6;
              ptVar1[extraout_EAX_02].super__Tuple_impl<0UL,_int,_int,_double>.
              super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                   (_Tuple_impl<2UL,_double>)local_158;
            }
            m((void *)(ulong)(uint)this->n,iVar9,(char *)(uVar32 & 0xffffffff),iVar8,iVar5);
            ptVar1 = (this->codon_index_y).
                     super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_03;
            if (*(double *)
                 &(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                  super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <= local_158 &&
                local_158 !=
                *(double *)
                 &(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                  super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>) {
              m((void *)(ulong)(uint)this->n,iVar9,(char *)(uVar32 & 0xffffffff),iVar8,iVar5);
              ptVar1 = (this->codon_index_y).
                       super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(int *)&ptVar1[extraout_EAX_04].super__Tuple_impl<0UL,_int,_int,_double>.
                       super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar6;
              ptVar1[extraout_EAX_04].super__Tuple_impl<0UL,_int,_int,_double>.
              super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl =
                   iVar6;
              ptVar1[extraout_EAX_04].super__Tuple_impl<0UL,_int,_int,_double>.
              super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                   (_Tuple_impl<2UL,_double>)local_158;
            }
            pdVar13 = Access(this,iVar9,iVar9,iVar8,iVar5,iVar6,iVar6);
            *pdVar13 = local_158;
            paiVar18 = paiVar18 + 1;
            paiVar17 = paiVar17 + 1;
          }
        }
        local_e8 = (int (*) [3])(*local_e8 + 1);
        local_e0 = (int (*) [3])(*local_e0 + 1);
      }
      local_128 = local_128 - 1;
      paaiVar16 = (int (*) [6] [3])((*paaiVar16)[0] + 1);
    }
  }
  uVar32 = 1;
  local_b0 = 0;
  local_c0 = 0.0;
  do {
    if ((long)(int)pvVar25 <= (long)uVar32) {
      uVar31 = (int)pvVar25 - 1;
      m(pvVar25,0,(char *)(ulong)uVar31,0,2);
      iVar5 = *(int *)&(this->codon_index).
                       super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_11].
                       super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                       field_0xc;
      m((void *)(ulong)(uint)this->n,0,(char *)(ulong)(this->n - 1),0,2);
      find_bp_abi_cxx11_(&bp,this,0,uVar31,0,2,iVar5,
                         (this->codon_index).
                         super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_12].
                         super__Tuple_impl<0UL,_int,_int,_double>.
                         super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>.
                         _M_head_impl,0);
      uVar31 = this->n - 1;
      m((void *)(ulong)(uint)this->n,0,(char *)(ulong)uVar31,0,2);
      iVar5 = *(int *)&(this->codon_index).
                       super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_13].
                       super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                       field_0xc;
      m((void *)(ulong)(uint)this->n,0,(char *)(ulong)(this->n - 1),0,2);
      find_bp_abi_cxx11_(&rna,this,0,uVar31,0,2,iVar5,
                         (this->codon_index).
                         super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_14].
                         super__Tuple_impl<0UL,_int,_int,_double>.
                         super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>.
                         _M_head_impl,1);
      poVar11 = std::operator<<(fout,"corresponding base pairs: ");
      poVar11 = std::operator<<(poVar11,(string *)&bp);
      poVar11 = std::operator<<(poVar11,",length: ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::endl<char,std::char_traits<char>>(poVar11);
      poVar11 = std::operator<<(fout,"corresponding rna: ");
      poVar11 = std::operator<<(poVar11,(string *)&rna);
      poVar11 = std::operator<<(poVar11,",size: ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::endl<char,std::char_traits<char>>(poVar11);
      std::operator<<(fout,"max base pair: ");
      poVar11 = std::ostream::_M_insert<double>(local_c0);
      std::endl<char,std::char_traits<char>>(poVar11);
      std::chrono::_V2::system_clock::now();
      poVar11 = std::operator<<(fout,"Time taken by program is : ");
      std::ostream::_M_insert<long>((long)poVar11);
      poVar11 = std::operator<<(fout,"sec");
      std::endl<char,std::char_traits<char>>(poVar11);
      uVar31 = this->n - 1;
      m((void *)(ulong)(uint)this->n,0,(char *)(ulong)uVar31,0,2);
      iVar5 = *(int *)&(this->codon_index).
                       super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_15].
                       super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                       field_0xc;
      m((void *)(ulong)(uint)this->n,0,(char *)(ulong)(this->n - 1),0,2);
      pdVar13 = Access(this,0,uVar31,0,2,iVar5,
                       (this->codon_index).
                       super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_16].
                       super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                       super__Head_base<1UL,_int,_false>._M_head_impl);
      std::_Tuple_impl<0ul,double,std::__cxx11::string,std::__cxx11::string>::
      _Tuple_impl<double&,std::__cxx11::string&,std::__cxx11::string&,void>
                ((_Tuple_impl<0ul,double,std::__cxx11::string,std::__cxx11::string> *)
                 __return_storage_ptr__,pdVar13,&rna,&bp);
      std::__cxx11::string::~string((string *)&rna);
      std::__cxx11::string::~string((string *)&bp);
      return __return_storage_ptr__;
    }
    local_e0 = (int (*) [3])local_b0;
    local_a8 = 1;
    uVar27 = 0;
    while (lVar19 = uVar32 + uVar27, lVar19 < (int)pvVar25) {
      iVar5 = (int)uVar27;
      b_00 = (int)uVar32 + iVar5;
      pcVar24 = (char *)(ulong)b_00;
      piVar2 = (this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar30 = uVar27 + 1;
      iVar6 = iVar5 + 1;
      uVar14 = lVar19 - 1;
      b = b_00 - 1;
      uVar21 = (ulong)b;
      uVar31 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[piVar2[lVar19]];
      if (n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[piVar2[lVar19]] < 1) {
        uVar31 = 0;
      }
      uVar3 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[piVar2[uVar27]];
      if (n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[piVar2[uVar27]] < 1) {
        uVar3 = 0;
      }
      uVar15 = 2;
      while (i_00 = (uint)uVar15, -1 < (int)i_00) {
        iVar7 = i_00 + 1;
        for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
          i_01 = (int)lVar12;
          a_00 = (int)lVar19;
          iVar8 = sigma(a_00,i_01);
          iVar9 = sigma(iVar5,i_00);
          if (this->g < iVar8 - iVar9) {
            iVar8 = i_01 + -1;
            for (uVar28 = 0; uVar28 != uVar3; uVar28 = uVar28 + 1) {
              for (uVar34 = 0; uVar34 != uVar31; uVar34 = uVar34 + 1) {
                piVar2 = (this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                bVar4 = complementary(nucleotides[piVar2[uVar27]][uVar28][uVar15],
                                      nucleotides[piVar2[lVar19]][uVar34][lVar12]);
                dVar35 = 0.0;
                iVar9 = (int)uVar28;
                x = (int)uVar34;
                if (bVar4) {
                  if (1 < i_00 || lVar12 == 0) {
                    dVar37 = dVar35;
                    if (lVar12 != 0 && i_00 == 2) {
                      if (1 < uVar32) {
                        iVar10 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start
                                 [(this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar30]];
                        iVar20 = 0;
                        if (iVar10 < 1) {
                          iVar10 = 0;
                          iVar20 = 0;
                        }
                        for (; iVar10 != iVar20; iVar20 = iVar20 + 1) {
                          pdVar13 = Access(this,iVar6,a_00,0,iVar8,iVar20,x);
                          dVar37 = *pdVar13;
                          if (*pdVar13 <= dVar35) {
                            dVar37 = dVar35;
                          }
                          dVar35 = dVar37;
                        }
                        dVar35 = dVar35 + 1.0;
                        if (dVar35 <= 0.0) {
                          dVar35 = 0.0;
                        }
                      }
                      dVar37 = dVar35;
                      if (uVar32 == 1) {
                        pdVar13 = Access(this,iVar6,a_00,0,iVar8,x,x);
                        dVar37 = *pdVar13 + 1.0;
                        if (*pdVar13 + 1.0 <= dVar35) {
                          dVar37 = dVar35;
                        }
                      }
                    }
                    if (1 < i_00 || lVar12 != 0) {
                      dVar35 = dVar37;
                      if (lVar12 == 0 && i_00 == 2) {
                        if (uVar30 < uVar14) {
                          piVar2 = (this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                          iVar20 = 0;
                          iVar10 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[piVar2[lVar19 + -1]];
                          if (n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[piVar2[lVar19 + -1]] < 1) {
                            iVar10 = 0;
                          }
                          iVar29 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[piVar2[uVar30]];
                          if (n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[piVar2[uVar30]] < 1) {
                            iVar29 = 0;
                          }
                          local_148 = 0.0;
                          for (; iVar20 != iVar29; iVar20 = iVar20 + 1) {
                            for (iVar26 = 0; iVar10 != iVar26; iVar26 = iVar26 + 1) {
                              pdVar13 = Access(this,iVar6,(int)uVar14,0,2,iVar20,iVar26);
                              dVar35 = *pdVar13;
                              if (*pdVar13 <= local_148) {
                                dVar35 = local_148;
                              }
                              local_148 = dVar35;
                            }
                          }
                          dVar35 = local_148 + 1.0;
                          if (local_148 + 1.0 <= dVar37) {
                            dVar35 = dVar37;
                          }
                        }
                        local_158 = dVar35;
                        if (uVar30 == uVar14) {
                          iVar10 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start
                                   [(this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar30]];
                          iVar20 = 0;
                          if (iVar10 < 1) {
                            iVar10 = 0;
                          }
                          dVar37 = 0.0;
                          for (; iVar10 != iVar20; iVar20 = iVar20 + 1) {
                            pdVar13 = Access(this,iVar6,(int)uVar30,0,2,iVar20,iVar20);
                            dVar36 = *pdVar13;
                            if (*pdVar13 <= dVar37) {
                              dVar36 = dVar37;
                            }
                            dVar37 = dVar36;
                          }
                          local_158 = dVar37 + 1.0;
                          if (dVar37 + 1.0 <= dVar35) {
                            local_158 = dVar35;
                          }
                        }
                        iVar10 = sigma(a_00,0);
                        iVar20 = sigma(iVar5,2);
                        dVar35 = local_158;
                        if ((iVar10 + -1 == iVar20 + this->g) && (dVar35 = 1.0, 1.0 <= local_158)) {
                          dVar35 = local_158;
                        }
                      }
                    }
                    else {
                      dVar36 = dVar37;
                      if (uVar27 < uVar21) {
                        iVar20 = 0;
                        iVar10 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start
                                 [(this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar19 + -1]];
                        if (n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start
                            [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar19 + -1]] < 1) {
                          iVar10 = 0;
                        }
                        dVar35 = 0.0;
                        for (; iVar10 != iVar20; iVar20 = iVar20 + 1) {
                          pdVar13 = Access(this,iVar5,b,iVar7,2,iVar9,iVar20);
                          dVar36 = *pdVar13;
                          if (*pdVar13 <= dVar35) {
                            dVar36 = dVar35;
                          }
                          dVar35 = dVar36;
                        }
                        dVar36 = dVar35 + 1.0;
                        if (dVar35 + 1.0 <= dVar37) {
                          dVar36 = dVar37;
                        }
                      }
                      dVar35 = dVar36;
                      if (uVar27 == uVar21) {
                        pdVar13 = Access(this,iVar5,b,iVar7,2,iVar9,iVar9);
                        dVar35 = *pdVar13 + 1.0;
                        if (*pdVar13 + 1.0 <= dVar36) {
                          dVar35 = dVar36;
                        }
                      }
                    }
                    goto LAB_00113901;
                  }
                  pdVar13 = Access(this,iVar5,b_00,iVar7,iVar8,iVar9,x);
                  dVar35 = *pdVar13 + 1.0;
                  if (dVar35 <= 0.0) {
                    dVar35 = 0.0;
                  }
LAB_0011390d:
                  pdVar13 = Access(this,iVar5,b_00,iVar7,i_01,iVar9,x);
                  dVar37 = *pdVar13;
                  if (*pdVar13 <= dVar35) {
                    dVar37 = dVar35;
                  }
                }
                else {
LAB_00113901:
                  dVar37 = dVar35;
                  if (i_00 < 2) goto LAB_0011390d;
                }
                local_158 = dVar37;
                if (lVar12 != 0) {
                  pdVar13 = Access(this,iVar5,b_00,i_00,iVar8,iVar9,x);
                  local_158 = *pdVar13;
                  if (*pdVar13 <= dVar37) {
                    local_158 = dVar37;
                  }
                }
                if (i_00 == 2) {
                  dVar35 = local_158;
                  if (1 < uVar32) {
                    iVar10 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start
                             [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar30]];
                    iVar20 = 0;
                    if (iVar10 < 1) {
                      iVar10 = 0;
                      iVar20 = 0;
                    }
                    for (; dVar35 = local_158, iVar10 != iVar20; iVar20 = iVar20 + 1) {
                      pdVar13 = Access(this,iVar6,a_00,0,i_01,iVar20,x);
                      dVar35 = *pdVar13;
                      if (*pdVar13 <= local_158) {
                        dVar35 = local_158;
                      }
                      local_158 = dVar35;
                    }
                  }
                  local_158 = dVar35;
                  if (uVar32 == 1) {
                    pdVar13 = Access(this,iVar6,a_00,0,i_01,x,x);
                    local_158 = *pdVar13;
                    if (*pdVar13 <= dVar35) {
                      local_158 = dVar35;
                    }
                  }
                }
                dVar35 = local_158;
                if (lVar12 == 0) {
                  if (uVar27 < uVar21) {
                    iVar20 = 0;
                    iVar10 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start
                             [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar19 + -1]];
                    if (n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar19 + -1]] < 1) {
                      iVar10 = iVar20;
                    }
                    for (; iVar10 != iVar20; iVar20 = iVar20 + 1) {
                      pdVar13 = Access(this,iVar5,b,i_00,2,iVar9,iVar20);
                      dVar35 = *pdVar13;
                      if (*pdVar13 <= local_158) {
                        dVar35 = local_158;
                      }
                      local_158 = dVar35;
                    }
                  }
                  dVar35 = local_158;
                  if (uVar27 == uVar21) {
                    pdVar13 = Access(this,iVar5,b,i_00,2,iVar9,iVar9);
                    dVar35 = *pdVar13;
                    if (*pdVar13 <= local_158) {
                      dVar35 = local_158;
                    }
                  }
                }
                uVar22 = local_a8;
                local_158 = dVar35;
                if ((long)uVar27 < (long)(int)(b_00 - 2)) {
                  while (uVar33 = uVar22, (int (*) [3])uVar33 != local_e0) {
                    piVar2 = (this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    iVar10 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[piVar2[uVar33 + 1]];
                    iVar29 = 0;
                    iVar20 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[piVar2[uVar33]];
                    if (n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[piVar2[uVar33]] < 1) {
                      iVar20 = iVar29;
                    }
                    if (iVar10 < 1) {
                      iVar10 = 0;
                    }
                    for (; uVar22 = uVar33 + 1, iVar29 != iVar10; iVar29 = iVar29 + 1) {
                      for (iVar26 = 0; iVar20 != iVar26; iVar26 = iVar26 + 1) {
                        pdVar13 = Access(this,iVar5,(int)uVar33,i_00,2,iVar9,iVar26);
                        dVar35 = *pdVar13;
                        pdVar13 = Access(this,(int)(uVar33 + 1),a_00,0,i_01,iVar29,x);
                        dVar37 = dVar35 + *pdVar13;
                        if (dVar35 + *pdVar13 <= local_158) {
                          dVar37 = local_158;
                        }
                        local_158 = dVar37;
                      }
                    }
                  }
                }
                if (uVar27 < uVar21) {
                  iVar10 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start
                           [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar30]];
                  iVar20 = 0;
                  if (iVar10 < 1) {
                    iVar10 = 0;
                    iVar20 = 0;
                  }
                  for (; iVar10 != iVar20; iVar20 = iVar20 + 1) {
                    pdVar13 = Access(this,iVar5,iVar5,i_00,2,iVar9,iVar9);
                    dVar35 = *pdVar13;
                    pdVar13 = Access(this,iVar6,a_00,0,i_01,iVar20,x);
                    dVar37 = dVar35 + *pdVar13;
                    if (dVar35 + *pdVar13 <= local_158) {
                      dVar37 = local_158;
                    }
                    local_158 = dVar37;
                  }
                  if (uVar27 < uVar21) {
                    iVar20 = 0;
                    iVar10 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start
                             [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar19 + -1]];
                    if (n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar19 + -1]] < 1) {
                      iVar10 = iVar20;
                    }
                    for (; iVar10 != iVar20; iVar20 = iVar20 + 1) {
                      pdVar13 = Access(this,iVar5,b,i_00,2,iVar9,iVar20);
                      dVar35 = *pdVar13;
                      pdVar13 = Access(this,a_00,a_00,0,i_01,x,x);
                      dVar37 = dVar35 + *pdVar13;
                      if (dVar35 + *pdVar13 <= local_158) {
                        dVar37 = local_158;
                      }
                      local_158 = dVar37;
                    }
                  }
                }
                dVar35 = local_158;
                if (uVar27 == uVar21) {
                  pdVar13 = Access(this,iVar5,iVar5,i_00,2,iVar9,iVar9);
                  dVar37 = *pdVar13;
                  pdVar13 = Access(this,a_00,a_00,0,i_01,x,x);
                  dVar35 = dVar37 + *pdVar13;
                  if (dVar37 + *pdVar13 <= local_158) {
                    dVar35 = local_158;
                  }
                }
                uVar22 = uVar27;
                local_158 = dVar35;
                if (uVar27 < uVar21) {
                  while ((int (*) [3])uVar22 != local_e0) {
                    uVar22 = uVar22 + 1;
                    iVar10 = 0;
                    while (iVar20 = iVar10, iVar20 != 2) {
                      iVar26 = 0;
                      iVar29 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start
                               [(this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar22]];
                      if (n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar22]] < 1) {
                        iVar29 = iVar26;
                      }
                      for (; iVar10 = iVar20 + 1, iVar29 != iVar26; iVar26 = iVar26 + 1) {
                        pdVar13 = Access(this,iVar5,(int)uVar22,i_00,iVar20,iVar9,iVar26);
                        dVar35 = *pdVar13;
                        pdVar13 = Access(this,(int)uVar22,a_00,iVar20 + 1,i_01,iVar26,x);
                        dVar37 = dVar35 + *pdVar13;
                        if (dVar35 + *pdVar13 <= local_158) {
                          dVar37 = local_158;
                        }
                        local_158 = dVar37;
                      }
                    }
                  }
                }
                uVar22 = uVar15;
                dVar35 = local_158;
                if (i_00 < 2) {
                  while (local_158 = dVar35, iVar10 = (int)uVar22, iVar10 != 2) {
                    pdVar13 = Access(this,iVar5,iVar5,i_00,iVar10,iVar9,iVar9);
                    dVar37 = *pdVar13;
                    uVar22 = (ulong)(iVar10 + 1U);
                    pdVar13 = Access(this,iVar5,b_00,iVar10 + 1U,i_01,iVar9,x);
                    dVar35 = dVar37 + *pdVar13;
                    if (dVar37 + *pdVar13 <= local_158) {
                      dVar35 = local_158;
                    }
                  }
                }
                if (lVar12 != 0) {
                  lVar23 = 0;
                  dVar35 = local_158;
                  while (local_158 = dVar35, lVar12 != lVar23) {
                    pdVar13 = Access(this,iVar5,b_00,i_00,(int)lVar23,iVar9,x);
                    dVar37 = *pdVar13;
                    lVar23 = lVar23 + 1;
                    pdVar13 = Access(this,a_00,a_00,(int)lVar23,i_01,x,x);
                    dVar35 = dVar37 + *pdVar13;
                    if (dVar37 + *pdVar13 <= local_158) {
                      dVar35 = local_158;
                    }
                  }
                }
                m((void *)(ulong)(uint)this->n,iVar5,pcVar24,i_00,i_01);
                ptVar1 = (this->codon_index).
                         super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_05;
                if (*(double *)
                     &(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                      super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <=
                    local_158 &&
                    local_158 !=
                    *(double *)
                     &(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                      super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>) {
                  m((void *)(ulong)(uint)this->n,iVar5,pcVar24,i_00,i_01);
                  ptVar1 = (this->codon_index).
                           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  *(int *)&ptVar1[extraout_EAX_06].super__Tuple_impl<0UL,_int,_int,_double>.
                           super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar9;
                  ptVar1[extraout_EAX_06].super__Tuple_impl<0UL,_int,_int,_double>.
                  super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl
                       = x;
                  ptVar1[extraout_EAX_06].super__Tuple_impl<0UL,_int,_int,_double>.
                  super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                       (_Tuple_impl<2UL,_double>)local_158;
                }
                m((void *)(ulong)(uint)this->n,iVar5,pcVar24,i_00,i_01);
                ptVar1 = (this->codon_index_x).
                         super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_07;
                if (*(double *)
                     &(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                      super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <=
                    local_158 &&
                    local_158 !=
                    *(double *)
                     &(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                      super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>) {
                  m((void *)(ulong)(uint)this->n,iVar5,pcVar24,i_00,i_01);
                  ptVar1 = (this->codon_index_x).
                           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  *(int *)&ptVar1[extraout_EAX_08].super__Tuple_impl<0UL,_int,_int,_double>.
                           super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar9;
                  ptVar1[extraout_EAX_08].super__Tuple_impl<0UL,_int,_int,_double>.
                  super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl
                       = x;
                  ptVar1[extraout_EAX_08].super__Tuple_impl<0UL,_int,_int,_double>.
                  super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                       (_Tuple_impl<2UL,_double>)local_158;
                }
                m((void *)(ulong)(uint)this->n,iVar5,pcVar24,i_00,i_01);
                ptVar1 = (this->codon_index_y).
                         super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_09;
                if (*(double *)
                     &(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                      super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <=
                    local_158 &&
                    local_158 !=
                    *(double *)
                     &(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                      super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>) {
                  m((void *)(ulong)(uint)this->n,iVar5,pcVar24,i_00,i_01);
                  ptVar1 = (this->codon_index_y).
                           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  *(int *)&ptVar1[extraout_EAX_10].super__Tuple_impl<0UL,_int,_int,_double>.
                           super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar9;
                  ptVar1[extraout_EAX_10].super__Tuple_impl<0UL,_int,_int,_double>.
                  super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl
                       = x;
                  ptVar1[extraout_EAX_10].super__Tuple_impl<0UL,_int,_int,_double>.
                  super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                       (_Tuple_impl<2UL,_double>)local_158;
                }
                pdVar13 = Access(this,iVar5,b_00,i_00,i_01,iVar9,x);
                *pdVar13 = local_158;
                if (local_158 <= local_c0) {
                  local_158 = local_c0;
                }
                local_c0 = local_158;
              }
            }
          }
        }
        uVar15 = (ulong)(i_00 - 1);
      }
      local_a8 = local_a8 + 1;
      local_e0 = (int (*) [3])((long)local_e0 + 1);
      uVar27 = uVar30;
      pvVar25 = (void *)(ulong)(uint)this->n;
    }
    uVar32 = uVar32 + 1;
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

tuple<double, string, string> Nussinov::nussinov(ostream &fout) {
    auto start = chrono::high_resolution_clock::now();
    fout << "Nussinov" << endl;

    double ans = 0;
    double ret = 0;
    double local_max = 0;

    // when a == b
    for (int a = 0,b; a < n; a++) {
        b=a;
        const int n_codon_a = n_codon[protein[a]];
        for (int l = 0; l < 3; l++) {
            for (int i = 0 , j; i+l < 3; i++) {
                j = i + l;
                if (sigma(b, j) - sigma(a, i) <= g) continue;
                for (int x = 0; x < n_codon_a; x++) {
                    ret = 0;
                    if (complementary(nucleotides[protein[a]][x][i], nucleotides[protein[b]][x][j])) {
                        // F [a][b][i + 1][j − 1][x][x] + 1
                        if (i <= 1 && j >= 1 && i < j - 1) {
                            ret = max(ret, Access(a, b,i + 1, j - 1, x, x) + 1);
                        }

                    }

                    //F [a][b][i + 1][j][x][x]
                    if (i <= 1 && i + 1 <= j) {
                        ret = max(ret, Access(a, b, i + 1, j, x, x));
                    }
                    //F [a][b][i][j − 1][x][x]
                    if (j >= 1 && i <= j - 1) {
                        ret = max(ret, Access(a, b, i, j - 1, x, x));
                    }

                    if (ret > get<2>(codon_index[m(n, a, b,i,j)])) {
                        codon_index[m(n,a,b,i,j)] = make_tuple(x,x,ret);
                    }
                    if (ret > get<2>(codon_index_x[m(n, a, b,i,j,x)])) {
                        codon_index_x[m(n,a,b,i,j,x)] = make_tuple(x,x,ret);
                    }
                    if (ret > get<2>(codon_index_y[m(n, a, b,i,j,x)])) {
                        codon_index_y[m(n,a,b,i,j,x)] = make_tuple(x,x,ret);
                    }
                    Access(a, b, i, j, x, x) = ret;
                }
//                cout << "a: " << a << ",b: " << b << ",i: " << i << ",j: " << j << ",index: " << (9*n*(b-a)+(3*j-2*i)) << endl;
            }
        }
    }


    for (int len = 1; len < n; len++) {
        for(int a = 0,b; a+len < n; a++){
            b=a+len;
            const int n_codon_a = n_codon[protein[a]];
            const int n_codon_b = n_codon[protein[b]];
            for (int i = 2; i >= 0; i--) {
                for (int j = 0; j < 3; j++) {
                    if (sigma(b,j) - sigma(a,i) <= g) continue;
                    for (int x = 0; x < n_codon_a; x++) {
                        for (int y = 0; y < n_codon_b; y++) {
                            ret = 0;
                            // i, j pair
                            if (complementary(nucleotides[protein[a]][x][i], nucleotides[protein[b]][y][j])) {
                                //F [a][b][i + 1][j − 1][x][y] + 1
                                if (i <= 1 && j >= 1) {
                                    ret = max(ret, Access(a, b, i + 1,j - 1,x,y) + 1);
                                }

                                if (i == 2 && j >=1) {
                                    // 1 + maxx′ ∈S(va+1){1 + F [a + 1][b][1][j − 1][x′][y]}
                                    if (a + 1 < b) {
                                        const int n_codon_an = n_codon[protein[a+1]];
                                        local_max = 0;
                                        for (int p = 0; p < n_codon_an; p++) {
                                            local_max = max(local_max, Access(a+1, b, 0, j - 1,p,y));
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1 + F [a + 1][b][1][j − 1][y][y]
                                    if (a + 1 == b) {
                                        ret = max(ret, Access(a+1, b, 0, j-1, y, y) + 1);
                                    }
                                }

                                if (i <= 1 && j == 0) {
                                    // 1 + maxy′∈S(vb−1){F [a][b − 1][i + 1][3][x][y′]}
                                    if (a < b - 1) {
                                        const int n_codon_bp = n_codon[protein[b-1]];
                                        local_max = 0;
                                        for (int q = 0; q < n_codon_bp; q++) {
                                            local_max = max(local_max, Access(a, b-1, i + 1, 2, x, q));
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1 + F [a][b − 1][i + 1][3][x][x]
                                    if (a == b - 1) {
                                        ret = max(ret, Access(a, b-1, i+1, 2, x, x) + 1);
                                    }
                                }

                                if (i == 2 && j == 0) {
                                    // 1 + maxx′ ∈S(va+1),y′ ∈S(vb−1){F [a + 1][b − 1][1][3][x′][y′]}
                                    if (a + 1 < b - 1) {
                                        const int n_codon_an = n_codon[protein[a+1]];
                                        const int n_codon_bp = n_codon[protein[b-1]];
                                        local_max = 0;
                                        for (int p = 0; p < n_codon_an; p++) {
                                            for (int q = 0; q < n_codon_bp; q++) {
                                                local_max = max(local_max, Access(a+1, b-1, 0,2,p,q));
                                            }
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1 + maxx′ ∈S(va+1){F [a + 1][b − 1][1][3][x′][x′]}
                                    if (a + 1 == b - 1) {
                                        const int n_codon_an = n_codon[protein[a+1]];
                                        local_max = 0;
                                        for (int p = 0; p < n_codon_an; p++) {
                                            local_max = max(local_max, Access(a+1, b-1, 0,2,p,p));
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1
                                    if (sigma(b,j) - 1 == sigma(a,i) + g) { //
                                        ret = max(ret, (double)1.0);
                                    }
                                }

                            }
                            // F [a][b][i + 1][j][x][y]
                            if (i <= 1) {
                                ret = max(ret, Access(a, b, i + 1,j,x,y));
                            }
                            // F [a][b][i][j − 1][x][y]
                            if (j >= 1) {
                                ret = max(ret, Access(a, b, i,j - 1,x,y));
                            }

                            if (i == 2) {
                                // maxx′ ∈S(va+1) F [a + 1][b][1][j][x′][y]
                                if (a + 1 < b) {
                                    const int n_codon_an = n_codon[protein[a+1]];
                                    for (int p = 0; p < n_codon_an; p++) {
                                        ret = max(ret, Access(a+1, b, 0, j,p,y));
                                    }
                                }
                                // F [a + 1][b][1][j][y][y]
                                if (a + 1 == b) {
                                    ret = max(ret, Access(a+1, b, 0, j, y, y));
                                }
                            }

                            if (j == 0) {
                                // maxy′ ∈S(vb−1 ) F [a][b − 1][i][3][x][y′]
                                if (a < b - 1) {
                                    const int n_codon_bp = n_codon[protein[b-1]];
                                    for (int q = 0; q < n_codon_bp; q++) {
                                        ret = max(ret, Access(a, b - 1, i, 2, x, q));
                                    }
                                }
                                // F [a][b − 1][i][3][x][x]
                                if (a == b - 1) {
                                    ret = max(ret, Access(a, b - 1, i, 2, x, x));
                                }
                            }

                            // bifurication

                            // maxa<c<b−1,y′ ∈S(vc ),x′∈S(vc+1){F [a][c][i][3][x][y′] + F [c + 1][b][1][j][x′][y]}
                            if (a < b - 2) {
                                for (int c = a + 1; c < b-1; c++) {
                                    const int n_codon_cn = n_codon[protein[c+1]];
                                    const int n_codon_c = n_codon[protein[c]];
                                    for (int p = 0; p < n_codon_cn; p++) {
                                        for (int q = 0; q < n_codon_c; q++) {
                                            ret = max(ret, Access(a,c, i,2,x,q) + Access(c + 1, b, 0,j,p,y));
                                        }
                                    }
                                }
                            }
                            // maxx′ ∈S(va+1){F [a][a][i][3][x][x] + F [a + 1][b][1][j][x′][y]}
                            if (a < b-1 && i <= 2) {
                                const int n_codon_an = n_codon[protein[a+1]];
                                for (int p = 0; p < n_codon_an; p++) {
                                    ret = max(ret, Access(a, a, i, 2, x, x) + Access(a + 1, b, 0, j, p, y));
                                }
                            }
                            // maxy′∈S(vb−1 ){F [a][b − 1][i][3][x][y′] + F [b][b][1][j][y][y]}
                            if (a < b - 1 && j >= 0) {
                                const int n_codon_bp = n_codon[protein[b-1]];
                                for (int q = 0; q < n_codon_bp; q++) {
                                    ret = max(ret, Access(a, b - 1, i, 2, x, q) + Access(b, b, 0, j, y, y));
                                }
                            }
                            // F [a][a][i][3][x][x] + F [b][b][1][j][y][y]
                            if (a == b - 1 && i <= 2 && j >= 0) {
                                ret = max(ret, Access(a, a, i, 2, x, x) + Access(b, b, 0, j, y, y));
                            }
                            // maxk<3,a<c<b,x′ ∈S(vc ){F [a][c][i][k][x][x′] + F [c][b][k + 1][j][x′][y]}
                            if (a < b - 1) {
                                for (int c = a+1; c < b; c++) {
                                    for (int k = 0; k < 2; k++) {
                                        const int n_codon_c = n_codon[protein[c]];
                                        for (int q = 0; q < n_codon_c; q++) {
                                            ret = max(ret, Access(a, c, i,k,x,q) + Access(c, b, k + 1,j,q,y));
                                        }
                                    }
                                }
                            }
                            // F [a][a][1][2][x][x] + F [a][b][3][j][x][y]
                            if (a < b && i <= 1) {
                                for (int k = i; k < 2; k++) {
                                    ret = max(ret, Access(a, a, i, k, x, x) + Access(a, b, k+1, j, x, y));
                                }
                            }
                            // F [a][b][i][1][x][y] + F [b][b][2][3][y][y]
                            if (a < b && j >= 1) {
                                for (int k = 0; k <= j - 1; k++) {
                                    ret = max(ret, Access(a, b, i, k, x, y) + Access(b, b, k+1, j, y, y));
                                }
                            }

                            if (ret > get<2>(codon_index[m(n, a, b,i,j)])) {
                                codon_index[m(n,a,b,i,j)] = make_tuple(x,y,ret);
                            }
                            if (ret > get<2>(codon_index_x[m(n, a, b,i,j,x)])) {
                                codon_index_x[m(n,a,b,i,j,x)] = make_tuple(x,y,ret);
                            }
                            if (ret > get<2>(codon_index_y[m(n, a, b,i,j,y)])) {
                                codon_index_y[m(n,a,b,i,j,y)] = make_tuple(x,y,ret);
                            }
                            Access(a, b, i, j, x, y) = ret;

                            ans = max(ans, ret);
                        }
                    }

//                    fout << "a: " << a << ",b: " << b << ",i: " << i << ",j: " << j << ",ret: " << ret << endl;
                }
            }

        }
    }


    // find rna and base pair
    string bp = find_bp(0, n-1, 0, 2, get<0>(codon_index[m(n,0,n-1,0,2)]), get<1>(codon_index[m(n,0,n-1,0,2)]), 0);
    string rna = find_bp(0, n-1, 0, 2, get<0>(codon_index[m(n,0,n-1,0,2)]), get<1>(codon_index[m(n,0,n-1,0,2)]), 1);


    fout << "corresponding base pairs: " << bp << ",length: " << bp.size() << endl;
//    fout << "corresponding base pairs (Nussinov Validation): " << nuss_bp << ",length: " << nuss_bp.size() << endl;
    fout << "corresponding rna: " << rna << ",size: " << rna.size() << endl;
//    fout << "corresponding rna2: " << rna2 << ",size: " << rna.size() << endl;
    fout << "max base pair: " << ans << endl;
//    fout << "max base pair: (Nussinov Validation): " << nuss_ans << endl;
    auto end = chrono::high_resolution_clock::now();
    long time_take = chrono::duration_cast<chrono::seconds>(end - start).count();
    fout << "Time taken by program is : " << time_take;
    fout << "sec" << endl;

    return make_tuple(Access(0, n-1, 0, 2, get<0>(codon_index[m(n,0,n-1,0,2)]), get<1>(codon_index[m(n,0,n-1,0,2)])), rna, bp); //,0,2
}